

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesLongMessageForm.cxx
# Opt level: O2

void __thiscall cmCursesLongMessageForm::HandleInput(cmCursesLongMessageForm *this)

{
  uint uVar1;
  int iVar2;
  char debugMessage [128];
  
  if ((this->super_cmCursesForm).Form == (FORM *)0x0) {
    return;
  }
  do {
    PrintKeys(this);
    uVar1 = wgetch(_stdscr);
    snprintf(debugMessage,0x80,"Message widget handling input, key: %d",(ulong)uVar1);
    cmCursesForm::LogMessage(debugMessage);
    if (uVar1 == 4) {
LAB_0014c07c:
      iVar2 = 0x22c;
LAB_0014c088:
      form_driver((this->super_cmCursesForm).Form,iVar2);
    }
    else {
      iVar2 = 0x22a;
      if (uVar1 == 0xe) goto LAB_0014c088;
      if (uVar1 == 0x10) goto LAB_0014c075;
      if (uVar1 == 0x15) {
LAB_0014c083:
        iVar2 = 0x22d;
        goto LAB_0014c088;
      }
      if (uVar1 == 0x6a) goto LAB_0014c088;
      if (uVar1 == 0x6b) {
LAB_0014c075:
        iVar2 = 0x22b;
        goto LAB_0014c088;
      }
      if (uVar1 == 0x102) goto LAB_0014c088;
      if (uVar1 == 0x103) goto LAB_0014c075;
      if (uVar1 == 0x152) goto LAB_0014c07c;
      if (uVar1 == 0x153) goto LAB_0014c083;
      if (uVar1 == 0x65) {
        return;
      }
      if (uVar1 == 0x6f) {
        return;
      }
    }
    (*(this->super_cmCursesForm)._vptr_cmCursesForm[4])(this);
    iVar2 = -1;
    if (_stdscr != 0) {
      iVar2 = *(short *)(_stdscr + 4) + 1;
    }
    wtouchln(_stdscr,0,iVar2,1);
    wrefresh(_stdscr);
  } while( true );
}

Assistant:

void cmCursesLongMessageForm::HandleInput()
{
  if (!this->Form) {
    return;
  }

  char debugMessage[128];

  for (;;) {
    this->PrintKeys();
    int key = getch();

#ifdef _WIN32
    if (key == KEY_RESIZE) {
      HandleResize();
    }
#endif // _WIN32

    snprintf(debugMessage, sizeof(debugMessage),
             "Message widget handling input, key: %d", key);
    cmCursesForm::LogMessage(debugMessage);

    // quit
    if (key == 'o' || key == 'e') {
      break;
    }
    if (key == KEY_DOWN || key == ctrl('n') || key == 'j') {
      form_driver(this->Form, REQ_SCR_FLINE);
    } else if (key == KEY_UP || key == ctrl('p') || key == 'k') {
      form_driver(this->Form, REQ_SCR_BLINE);
    } else if (key == KEY_NPAGE || key == ctrl('d')) {
      form_driver(this->Form, REQ_SCR_FPAGE);
    } else if (key == KEY_PPAGE || key == ctrl('u')) {
      form_driver(this->Form, REQ_SCR_BPAGE);
    }

    this->UpdateStatusBar();
    touchwin(stdscr);
    wrefresh(stdscr);
  }
}